

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLp.cpp
# Opt level: O2

void __thiscall HighsLp::unapplyMods(HighsLp *this)

{
  int iVar1;
  pointer pHVar2;
  pointer piVar3;
  pointer pdVar4;
  pointer pdVar5;
  pointer pdVar6;
  pointer pdVar7;
  pointer pHVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  
  pHVar2 = (this->integrality_).super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
           _M_impl.super__Vector_impl_data._M_start;
  piVar3 = (this->mods_).save_non_semi_variable_index.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar9 = (ulong)((long)(this->mods_).save_non_semi_variable_index.
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)piVar3) >> 2;
  uVar11 = 0;
  uVar10 = uVar9 & 0xffffffff;
  if ((int)uVar9 < 1) {
    uVar10 = uVar11;
  }
  for (; uVar10 != uVar11; uVar11 = uVar11 + 1) {
    iVar1 = piVar3[uVar11];
    pHVar2[iVar1] = pHVar2[iVar1] == kContinuous ^ kSemiInteger;
  }
  piVar3 = (this->mods_).save_inconsistent_semi_variable_index.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  uVar9 = (ulong)((long)(this->mods_).save_inconsistent_semi_variable_index.
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)piVar3) >> 2;
  pdVar4 = (this->mods_).save_inconsistent_semi_variable_lower_bound_value.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pdVar5 = (this->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar6 = (this->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar7 = (this->mods_).save_inconsistent_semi_variable_upper_bound_value.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pHVar2 = (this->mods_).save_inconsistent_semi_variable_type.
           super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
           super__Vector_impl_data._M_start;
  pHVar8 = (this->integrality_).super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar11 = 0;
  uVar10 = uVar9 & 0xffffffff;
  if ((int)uVar9 < 1) {
    uVar10 = uVar11;
  }
  for (; uVar10 != uVar11; uVar11 = uVar11 + 1) {
    iVar1 = piVar3[uVar11];
    pdVar5[iVar1] = pdVar4[uVar11];
    pdVar6[iVar1] = pdVar7[uVar11];
    pHVar8[iVar1] = pHVar2[uVar11];
  }
  piVar3 = (this->mods_).save_relaxed_semi_variable_lower_bound_index.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  uVar9 = (ulong)((long)(this->mods_).save_relaxed_semi_variable_lower_bound_index.
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)piVar3) >> 2;
  pdVar4 = (this->mods_).save_relaxed_semi_variable_lower_bound_value.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pdVar5 = (this->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar11 = 0;
  uVar10 = uVar9 & 0xffffffff;
  if ((int)uVar9 < 1) {
    uVar10 = uVar11;
  }
  for (; uVar10 != uVar11; uVar11 = uVar11 + 1) {
    pdVar5[piVar3[uVar11]] = pdVar4[uVar11];
  }
  piVar3 = (this->mods_).save_tightened_semi_variable_upper_bound_index.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  uVar9 = (ulong)((long)(this->mods_).save_tightened_semi_variable_upper_bound_index.
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)piVar3) >> 2;
  pdVar4 = (this->mods_).save_tightened_semi_variable_upper_bound_value.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pdVar5 = (this->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar11 = 0;
  uVar10 = uVar9 & 0xffffffff;
  if ((int)uVar9 < 1) {
    uVar10 = uVar11;
  }
  for (; uVar10 != uVar11; uVar11 = uVar11 + 1) {
    pdVar5[piVar3[uVar11]] = pdVar4[uVar11];
  }
  HighsLpMods::clear(&this->mods_);
  return;
}

Assistant:

void HighsLp::unapplyMods() {
  // Restore any non-semi types
  const HighsInt num_non_semi = this->mods_.save_non_semi_variable_index.size();
  for (HighsInt k = 0; k < num_non_semi; k++) {
    HighsInt iCol = this->mods_.save_non_semi_variable_index[k];
    assert(this->integrality_[iCol] == HighsVarType::kContinuous ||
           this->integrality_[iCol] == HighsVarType::kInteger);
    if (this->integrality_[iCol] == HighsVarType::kContinuous) {
      this->integrality_[iCol] = HighsVarType::kSemiContinuous;
    } else {
      this->integrality_[iCol] = HighsVarType::kSemiInteger;
    }
  }
  // Restore any inconsistent semi variables
  const HighsInt num_inconsistent_semi =
      this->mods_.save_inconsistent_semi_variable_index.size();
  if (!num_inconsistent_semi) {
    assert(
        !this->mods_.save_inconsistent_semi_variable_lower_bound_value.size());
    assert(
        !this->mods_.save_inconsistent_semi_variable_upper_bound_value.size());
    assert(!this->mods_.save_inconsistent_semi_variable_type.size());
  }
  for (HighsInt k = 0; k < num_inconsistent_semi; k++) {
    HighsInt iCol = this->mods_.save_inconsistent_semi_variable_index[k];
    this->col_lower_[iCol] =
        this->mods_.save_inconsistent_semi_variable_lower_bound_value[k];
    this->col_upper_[iCol] =
        this->mods_.save_inconsistent_semi_variable_upper_bound_value[k];
    this->integrality_[iCol] =
        this->mods_.save_inconsistent_semi_variable_type[k];
  }
  // Restore any relaxed lower bounds
  std::vector<HighsInt>& relaxed_semi_variable_lower_index =
      this->mods_.save_relaxed_semi_variable_lower_bound_index;
  std::vector<double>& relaxed_semi_variable_lower_value =
      this->mods_.save_relaxed_semi_variable_lower_bound_value;
  const HighsInt num_lower_bound = relaxed_semi_variable_lower_index.size();
  if (!num_lower_bound) {
    assert(!relaxed_semi_variable_lower_value.size());
  }
  for (HighsInt k = 0; k < num_lower_bound; k++) {
    HighsInt iCol = relaxed_semi_variable_lower_index[k];
    assert(this->integrality_[iCol] == HighsVarType::kSemiContinuous ||
           this->integrality_[iCol] == HighsVarType::kSemiInteger);
    this->col_lower_[iCol] = relaxed_semi_variable_lower_value[k];
  }
  // Restore any tightened upper bounds
  std::vector<HighsInt>& tightened_semi_variable_upper_bound_index =
      this->mods_.save_tightened_semi_variable_upper_bound_index;
  std::vector<double>& tightened_semi_variable_upper_bound_value =
      this->mods_.save_tightened_semi_variable_upper_bound_value;
  const HighsInt num_upper_bound =
      tightened_semi_variable_upper_bound_index.size();
  if (!num_upper_bound) {
    assert(!tightened_semi_variable_upper_bound_value.size());
  }
  for (HighsInt k = 0; k < num_upper_bound; k++) {
    HighsInt iCol = tightened_semi_variable_upper_bound_index[k];
    assert(this->integrality_[iCol] == HighsVarType::kSemiContinuous ||
           this->integrality_[iCol] == HighsVarType::kSemiInteger);
    this->col_upper_[iCol] = tightened_semi_variable_upper_bound_value[k];
  }

  this->mods_.clear();
}